

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void rule_print(FILE *out,rule *rp)

{
  symbol *psVar1;
  symbol *sp;
  int j;
  int i;
  rule *rp_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"%s",rp->lhs->name);
  fprintf((FILE *)out," ::=");
  for (sp._4_4_ = 0; sp._4_4_ < rp->nrhs; sp._4_4_ = sp._4_4_ + 1) {
    psVar1 = rp->rhs[sp._4_4_];
    if (psVar1->type == MULTITERMINAL) {
      fprintf((FILE *)out," %s",(*psVar1->subsym)->name);
      for (sp._0_4_ = 1; (int)sp < psVar1->nsubsym; sp._0_4_ = (int)sp + 1) {
        fprintf((FILE *)out,"|%s",psVar1->subsym[(int)sp]->name);
      }
    }
    else {
      fprintf((FILE *)out," %s",psVar1->name);
    }
  }
  return;
}

Assistant:

void rule_print(FILE *out, struct rule *rp){
  int i, j;
  fprintf(out, "%s",rp->lhs->name);
  /*    if( rp->lhsalias ) fprintf(out,"(%s)",rp->lhsalias); */
  fprintf(out," ::=");
  for(i=0; i<rp->nrhs; i++){
    struct symbol *sp = rp->rhs[i];
    if( sp->type==MULTITERMINAL ){
      fprintf(out," %s", sp->subsym[0]->name);
      for(j=1; j<sp->nsubsym; j++){
        fprintf(out,"|%s", sp->subsym[j]->name);
      }
    }else{
      fprintf(out," %s", sp->name);
    }
    /* if( rp->rhsalias[i] ) fprintf(out,"(%s)",rp->rhsalias[i]); */
  }
}